

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

RequiredError *
CLI::RequiredError::Option
          (RequiredError *__return_storage_ptr__,size_t min_option,size_t max_option,size_t used,
          string *option_list)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  char cVar3;
  ulong uVar4;
  long *plVar5;
  undefined8 *puVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  size_type *psVar8;
  ulong *puVar9;
  long *plVar10;
  size_t sVar11;
  char cVar12;
  ulong uVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  _Alloc_hider _Var15;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  ulong *local_1b0;
  long local_1a8;
  ulong local_1a0;
  long lStack_198;
  ulong *local_190;
  uint local_188;
  undefined4 uStack_184;
  ulong local_180 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  ulong *local_150;
  long local_148;
  ulong local_140;
  long lStack_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  uint local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  uVar4 = min_option ^ 1;
  if (((max_option ^ 1) == 0 && uVar4 == 0) && used == 0) {
    ::std::operator+(&local_1d0,"Exactly 1 option from [",option_list);
    plVar5 = (long *)::std::__cxx11::string::append((char *)&local_1d0);
    paVar7 = &local_50.field_2;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_50.field_2._M_allocated_capacity = *psVar8;
      local_50.field_2._8_8_ = plVar5[3];
      local_50._M_dataplus._M_p = (pointer)paVar7;
    }
    else {
      local_50.field_2._M_allocated_capacity = *psVar8;
      local_50._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_50._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    RequiredError(__return_storage_ptr__,&local_50);
    _Var15._M_p = local_50._M_dataplus._M_p;
LAB_00149d17:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var15._M_p != paVar7) {
      operator_delete(_Var15._M_p);
    }
    pbVar2 = &local_1d0;
  }
  else {
    if (((max_option ^ 1) != 0 || uVar4 != 0) || used < 2) {
      if (uVar4 == 0 && used == 0) {
        ::std::operator+(&local_1d0,"At least 1 option from [",option_list);
        plVar5 = (long *)::std::__cxx11::string::append((char *)&local_1d0);
        paVar7 = &local_90.field_2;
        psVar8 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_90.field_2._M_allocated_capacity = *psVar8;
          local_90.field_2._8_8_ = plVar5[3];
          local_90._M_dataplus._M_p = (pointer)paVar7;
        }
        else {
          local_90.field_2._M_allocated_capacity = *psVar8;
          local_90._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_90._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        RequiredError(__return_storage_ptr__,&local_90);
        _Var15._M_p = local_90._M_dataplus._M_p;
        goto LAB_00149d17;
      }
      if (used < min_option) {
        cVar12 = '\x01';
        if (9 < min_option) {
          sVar11 = min_option;
          cVar3 = '\x04';
          do {
            cVar12 = cVar3;
            if (sVar11 < 100) {
              cVar12 = cVar12 + -2;
              goto LAB_0014a135;
            }
            if (sVar11 < 1000) {
              cVar12 = cVar12 + -1;
              goto LAB_0014a135;
            }
            if (sVar11 < 10000) goto LAB_0014a135;
            bVar1 = 99999 < sVar11;
            sVar11 = sVar11 / 10000;
            cVar3 = cVar12 + '\x04';
          } while (bVar1);
          cVar12 = cVar12 + '\x01';
        }
LAB_0014a135:
        local_130 = &local_120;
        ::std::__cxx11::string::_M_construct((ulong)&local_130,cVar12);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_130->_M_local_buf,local_128,min_option);
        plVar5 = (long *)::std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,0x15bcc8);
        local_110 = &local_100;
        plVar10 = plVar5 + 2;
        if ((long *)*plVar5 == plVar10) {
          local_100 = *plVar10;
          lStack_f8 = plVar5[3];
        }
        else {
          local_100 = *plVar10;
          local_110 = (long *)*plVar5;
        }
        local_108 = plVar5[1];
        *plVar5 = (long)plVar10;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)::std::__cxx11::string::append((char *)&local_110);
        puVar9 = (ulong *)(plVar5 + 2);
        if ((ulong *)*plVar5 == puVar9) {
          local_1a0 = *puVar9;
          lStack_198 = plVar5[3];
          local_1b0 = &local_1a0;
        }
        else {
          local_1a0 = *puVar9;
          local_1b0 = (ulong *)*plVar5;
        }
        local_1a8 = plVar5[1];
        *plVar5 = (long)puVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        cVar12 = '\x01';
        if (9 < used) {
          sVar11 = used;
          cVar3 = '\x04';
          do {
            cVar12 = cVar3;
            if (sVar11 < 100) {
              cVar12 = cVar12 + -2;
              goto LAB_0014a287;
            }
            if (sVar11 < 1000) {
              cVar12 = cVar12 + -1;
              goto LAB_0014a287;
            }
            if (sVar11 < 10000) goto LAB_0014a287;
            bVar1 = 99999 < sVar11;
            sVar11 = sVar11 / 10000;
            cVar3 = cVar12 + '\x04';
          } while (bVar1);
          cVar12 = cVar12 + '\x01';
        }
LAB_0014a287:
        local_190 = local_180;
        ::std::__cxx11::string::_M_construct((ulong)&local_190,cVar12);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_190,local_188,used);
        uVar4 = CONCAT44(uStack_184,local_188) + local_1a8;
        uVar13 = 0xf;
        if (local_1b0 != &local_1a0) {
          uVar13 = local_1a0;
        }
        if (uVar13 < uVar4) {
          uVar13 = 0xf;
          if (local_190 != local_180) {
            uVar13 = local_180[0];
          }
          if (uVar13 < uVar4) goto LAB_0014a2f1;
          puVar6 = (undefined8 *)
                   ::std::__cxx11::string::replace((ulong)&local_190,0,(char *)0x0,(ulong)local_1b0)
          ;
        }
        else {
LAB_0014a2f1:
          puVar6 = (undefined8 *)
                   ::std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_190);
        }
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        psVar8 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_170.field_2._M_allocated_capacity = *psVar8;
          local_170.field_2._8_8_ = puVar6[3];
        }
        else {
          local_170.field_2._M_allocated_capacity = *psVar8;
          local_170._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_170._M_string_length = puVar6[1];
        *puVar6 = psVar8;
        puVar6[1] = 0;
        *(undefined1 *)psVar8 = 0;
        puVar6 = (undefined8 *)::std::__cxx11::string::append((char *)&local_170);
        local_150 = &local_140;
        puVar9 = puVar6 + 2;
        if ((ulong *)*puVar6 == puVar9) {
          local_140 = *puVar9;
          lStack_138 = puVar6[3];
        }
        else {
          local_140 = *puVar9;
          local_150 = (ulong *)*puVar6;
        }
        local_148 = puVar6[1];
        *puVar6 = puVar9;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)
                 ::std::__cxx11::string::_M_append
                           ((char *)&local_150,(ulong)(option_list->_M_dataplus)._M_p);
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        psVar8 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_1d0.field_2._M_allocated_capacity = *psVar8;
          local_1d0.field_2._8_8_ = puVar6[3];
        }
        else {
          local_1d0.field_2._M_allocated_capacity = *psVar8;
          local_1d0._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_1d0._M_string_length = puVar6[1];
        *puVar6 = psVar8;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        plVar5 = (long *)::std::__cxx11::string::append((char *)&local_1d0);
        paVar7 = &local_b0.field_2;
        psVar8 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_b0.field_2._M_allocated_capacity = *psVar8;
          local_b0.field_2._8_8_ = plVar5[3];
          local_b0._M_dataplus._M_p = (pointer)paVar7;
        }
        else {
          local_b0.field_2._M_allocated_capacity = *psVar8;
          local_b0._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_b0._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        RequiredError(__return_storage_ptr__,&local_b0,RequiredError);
        _Var15._M_p = local_b0._M_dataplus._M_p;
      }
      else {
        if (max_option == 1) {
          ::std::operator+(&local_1d0,"Requires at most 1 options be given from [",option_list);
          plVar5 = (long *)::std::__cxx11::string::append((char *)&local_1d0);
          paVar7 = &local_d0.field_2;
          psVar8 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_d0.field_2._M_allocated_capacity = *psVar8;
            local_d0.field_2._8_8_ = plVar5[3];
            local_d0._M_dataplus._M_p = (pointer)paVar7;
          }
          else {
            local_d0.field_2._M_allocated_capacity = *psVar8;
            local_d0._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_d0._M_string_length = plVar5[1];
          *plVar5 = (long)psVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          RequiredError(__return_storage_ptr__,&local_d0,RequiredError);
          _Var15._M_p = local_d0._M_dataplus._M_p;
          goto LAB_00149d17;
        }
        cVar12 = '\x01';
        if (9 < max_option) {
          sVar11 = max_option;
          cVar3 = '\x04';
          do {
            cVar12 = cVar3;
            if (sVar11 < 100) {
              cVar12 = cVar12 + -2;
              goto LAB_0014a499;
            }
            if (sVar11 < 1000) {
              cVar12 = cVar12 + -1;
              goto LAB_0014a499;
            }
            if (sVar11 < 10000) goto LAB_0014a499;
            bVar1 = 99999 < sVar11;
            sVar11 = sVar11 / 10000;
            cVar3 = cVar12 + '\x04';
          } while (bVar1);
          cVar12 = cVar12 + '\x01';
        }
LAB_0014a499:
        local_130 = &local_120;
        ::std::__cxx11::string::_M_construct((ulong)&local_130,cVar12);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_130->_M_local_buf,local_128,max_option);
        puVar6 = (undefined8 *)
                 ::std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,0x15bd8d);
        local_110 = &local_100;
        plVar5 = puVar6 + 2;
        if ((long *)*puVar6 == plVar5) {
          local_100 = *plVar5;
          lStack_f8 = puVar6[3];
        }
        else {
          local_100 = *plVar5;
          local_110 = (long *)*puVar6;
        }
        local_108 = puVar6[1];
        *puVar6 = plVar5;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)::std::__cxx11::string::append((char *)&local_110);
        puVar9 = puVar6 + 2;
        if ((ulong *)*puVar6 == puVar9) {
          local_1a0 = *puVar9;
          lStack_198 = puVar6[3];
          local_1b0 = &local_1a0;
        }
        else {
          local_1a0 = *puVar9;
          local_1b0 = (ulong *)*puVar6;
        }
        local_1a8 = puVar6[1];
        *puVar6 = puVar9;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        cVar12 = '\x01';
        if (9 < used) {
          sVar11 = used;
          cVar3 = '\x04';
          do {
            cVar12 = cVar3;
            if (sVar11 < 100) {
              cVar12 = cVar12 + -2;
              goto LAB_0014a5ea;
            }
            if (sVar11 < 1000) {
              cVar12 = cVar12 + -1;
              goto LAB_0014a5ea;
            }
            if (sVar11 < 10000) goto LAB_0014a5ea;
            bVar1 = 99999 < sVar11;
            sVar11 = sVar11 / 10000;
            cVar3 = cVar12 + '\x04';
          } while (bVar1);
          cVar12 = cVar12 + '\x01';
        }
LAB_0014a5ea:
        local_190 = local_180;
        ::std::__cxx11::string::_M_construct((ulong)&local_190,cVar12);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_190,local_188,used);
        uVar4 = CONCAT44(uStack_184,local_188) + local_1a8;
        uVar13 = 0xf;
        if (local_1b0 != &local_1a0) {
          uVar13 = local_1a0;
        }
        if (uVar13 < uVar4) {
          uVar13 = 0xf;
          if (local_190 != local_180) {
            uVar13 = local_180[0];
          }
          if (uVar13 < uVar4) goto LAB_0014a654;
          puVar6 = (undefined8 *)
                   ::std::__cxx11::string::replace((ulong)&local_190,0,(char *)0x0,(ulong)local_1b0)
          ;
        }
        else {
LAB_0014a654:
          puVar6 = (undefined8 *)
                   ::std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_190);
        }
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        psVar8 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_170.field_2._M_allocated_capacity = *psVar8;
          local_170.field_2._8_8_ = puVar6[3];
        }
        else {
          local_170.field_2._M_allocated_capacity = *psVar8;
          local_170._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_170._M_string_length = puVar6[1];
        *puVar6 = psVar8;
        puVar6[1] = 0;
        *(undefined1 *)psVar8 = 0;
        puVar6 = (undefined8 *)::std::__cxx11::string::append((char *)&local_170);
        local_150 = &local_140;
        puVar9 = puVar6 + 2;
        if ((ulong *)*puVar6 == puVar9) {
          local_140 = *puVar9;
          lStack_138 = puVar6[3];
        }
        else {
          local_140 = *puVar9;
          local_150 = (ulong *)*puVar6;
        }
        local_148 = puVar6[1];
        *puVar6 = puVar9;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)
                 ::std::__cxx11::string::_M_append
                           ((char *)&local_150,(ulong)(option_list->_M_dataplus)._M_p);
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        psVar8 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_1d0.field_2._M_allocated_capacity = *psVar8;
          local_1d0.field_2._8_8_ = puVar6[3];
        }
        else {
          local_1d0.field_2._M_allocated_capacity = *psVar8;
          local_1d0._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_1d0._M_string_length = puVar6[1];
        *puVar6 = psVar8;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        plVar5 = (long *)::std::__cxx11::string::append((char *)&local_1d0);
        paVar7 = &local_f0.field_2;
        psVar8 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_f0.field_2._M_allocated_capacity = *psVar8;
          local_f0.field_2._8_8_ = plVar5[3];
          local_f0._M_dataplus._M_p = (pointer)paVar7;
        }
        else {
          local_f0.field_2._M_allocated_capacity = *psVar8;
          local_f0._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_f0._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        RequiredError(__return_storage_ptr__,&local_f0,RequiredError);
        _Var15._M_p = local_f0._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var15._M_p != paVar7) {
        operator_delete(_Var15._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p);
      }
      if (local_150 != &local_140) {
        operator_delete(local_150);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      if (local_190 != local_180) {
        operator_delete(local_190);
      }
      if (local_1b0 != &local_1a0) {
        operator_delete(local_1b0);
      }
      if (local_110 != &local_100) {
        operator_delete(local_110);
      }
      paVar7 = &local_120;
      paVar14 = local_130;
      goto LAB_0014a069;
    }
    ::std::operator+(&local_170,"Exactly 1 option from [",option_list);
    plVar5 = (long *)::std::__cxx11::string::append((char *)&local_170);
    puVar9 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar9) {
      local_140 = *puVar9;
      lStack_138 = plVar5[3];
      local_150 = &local_140;
    }
    else {
      local_140 = *puVar9;
      local_150 = (ulong *)*plVar5;
    }
    local_148 = plVar5[1];
    *plVar5 = (long)puVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    cVar12 = '\x01';
    if (9 < used) {
      sVar11 = used;
      cVar3 = '\x04';
      do {
        cVar12 = cVar3;
        if (sVar11 < 100) {
          cVar12 = cVar12 + -2;
          goto LAB_00149ece;
        }
        if (sVar11 < 1000) {
          cVar12 = cVar12 + -1;
          goto LAB_00149ece;
        }
        if (sVar11 < 10000) goto LAB_00149ece;
        bVar1 = 99999 < sVar11;
        sVar11 = sVar11 / 10000;
        cVar3 = cVar12 + '\x04';
      } while (bVar1);
      cVar12 = cVar12 + '\x01';
    }
LAB_00149ece:
    local_1b0 = &local_1a0;
    ::std::__cxx11::string::_M_construct((ulong)&local_1b0,cVar12);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_1b0,(uint)local_1a8,used);
    uVar4 = 0xf;
    if (local_150 != &local_140) {
      uVar4 = local_140;
    }
    if (uVar4 < (ulong)(local_1a8 + local_148)) {
      uVar4 = 0xf;
      if (local_1b0 != &local_1a0) {
        uVar4 = local_1a0;
      }
      if (uVar4 < (ulong)(local_1a8 + local_148)) goto LAB_00149f3d;
      puVar6 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,(ulong)local_150);
    }
    else {
LAB_00149f3d:
      puVar6 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_1b0);
    }
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    psVar8 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_1d0.field_2._M_allocated_capacity = *psVar8;
      local_1d0.field_2._8_8_ = puVar6[3];
    }
    else {
      local_1d0.field_2._M_allocated_capacity = *psVar8;
      local_1d0._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_1d0._M_string_length = puVar6[1];
    *puVar6 = psVar8;
    puVar6[1] = 0;
    *(undefined1 *)psVar8 = 0;
    plVar5 = (long *)::std::__cxx11::string::append((char *)&local_1d0);
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_70.field_2._M_allocated_capacity = *psVar8;
      local_70.field_2._8_8_ = plVar5[3];
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar8;
      local_70._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_70._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    RequiredError(__return_storage_ptr__,&local_70,RequiredError);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    if (local_1b0 != &local_1a0) {
      operator_delete(local_1b0);
    }
    if (local_150 != &local_140) {
      operator_delete(local_150);
    }
    pbVar2 = &local_170;
  }
  paVar7 = &pbVar2->field_2;
  paVar14 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)(paVar7->_M_local_buf + -0x10);
LAB_0014a069:
  if (paVar14 != paVar7) {
    operator_delete(paVar14);
  }
  return __return_storage_ptr__;
}

Assistant:

static RequiredError Option(size_t min_option, size_t max_option, size_t used, const std::string &option_list) {
        if((min_option == 1) && (max_option == 1) && (used == 0))
            return RequiredError("Exactly 1 option from [" + option_list + "]");
        else if((min_option == 1) && (max_option == 1) && (used > 1))
            return RequiredError("Exactly 1 option from [" + option_list + "] is required and " + std::to_string(used) +
                                     " were given",
                                 ExitCodes::RequiredError);
        else if((min_option == 1) && (used == 0))
            return RequiredError("At least 1 option from [" + option_list + "]");
        else if(used < min_option)
            return RequiredError("Requires at least " + std::to_string(min_option) + " options used and only " +
                                     std::to_string(used) + "were given from [" + option_list + "]",
                                 ExitCodes::RequiredError);
        else if(max_option == 1)
            return RequiredError("Requires at most 1 options be given from [" + option_list + "]",
                                 ExitCodes::RequiredError);
        else
            return RequiredError("Requires at most " + std::to_string(max_option) + " options be used and " +
                                     std::to_string(used) + "were given from [" + option_list + "]",
                                 ExitCodes::RequiredError);
    }